

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void Am_Inter_Call_Method
               (Am_Object *inter_or_cmd,Am_Slot_Key method_slot,int x,int y,Am_Object *ref_obj,
               Am_Input_Char *ic,Am_Object *object_modified,Am_Inter_Location *points)

{
  Am_Generic_Procedure *pAVar1;
  bool bVar2;
  Am_ID_Tag AVar3;
  int iVar4;
  Am_Value *in_value;
  Am_Method_Wrapper *pAVar5;
  Am_Object *this;
  Am_Object *this_00;
  Am_Inter_Location AStack_78;
  uint local_6c;
  Am_Value local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar2 = Am_Object::Valid(inter_or_cmd);
  if (!bVar2) {
    return;
  }
  local_68.type = 0;
  local_68.value.wrapper_value = (Am_Wrapper *)0x0;
  local_6c = y;
  in_value = Am_Object::Get(inter_or_cmd,method_slot,1);
  Am_Value::operator=(&local_68,in_value);
  bVar2 = Am_Value::Valid(&local_68);
  if (!bVar2) goto LAB_001ae7ce;
  pAVar5 = Am_Value::operator_cast_to_Am_Method_Wrapper_(&local_68);
  iVar4 = (**(pAVar5->super_Am_Registered_Type)._vptr_Am_Registered_Type)(pAVar5);
  AVar3 = (Am_ID_Tag)iVar4;
  if (AVar3 == Am_Object_Method::Am_Object_Method_ID) {
    pAVar1 = pAVar5->Call;
    if (pAVar1 == (Am_Generic_Procedure *)0x0) goto LAB_001ae7ce;
    this_00 = &local_38;
    Am_Object::Am_Object(this_00,inter_or_cmd);
    (*pAVar1)(this_00);
  }
  else {
    if (AVar3 == Am_Mouse_Event_Method::Am_Mouse_Event_Method_ID) {
      pAVar1 = pAVar5->Call;
      if (pAVar1 == (Am_Generic_Procedure *)0x0) goto LAB_001ae7ce;
      this_00 = &local_40;
      Am_Object::Am_Object(this_00,inter_or_cmd);
      this = &local_48;
      Am_Object::Am_Object(this,ref_obj);
      (*pAVar1)(this_00,(ulong)(uint)x,(ulong)local_6c,this,(ulong)(uint)*ic);
    }
    else {
      if (AVar3 != Am_Current_Location_Method::Am_Current_Location_Method_ID) {
        Am_Error("Wrong type method: can only accept methods of types Am_Object_Method, Am_Mouse_Event_Method, or Am_Current_Location_Method."
                 ,inter_or_cmd,method_slot);
        goto LAB_001ae7ce;
      }
      bVar2 = Am_Inter_Location::Valid(points);
      if (!bVar2) {
        Am_Error("Method of type Current_Location_Method but no data points",inter_or_cmd,
                 method_slot);
      }
      pAVar1 = pAVar5->Call;
      if (pAVar1 == (Am_Generic_Procedure *)0x0) goto LAB_001ae7ce;
      Am_Object::Am_Object(&local_50,inter_or_cmd);
      Am_Object::Am_Object(&local_58,object_modified);
      Am_Inter_Location::Am_Inter_Location(&AStack_78,points);
      this_00 = &local_50;
      this = &local_58;
      (*pAVar1)(this_00,this,&AStack_78);
      Am_Inter_Location::~Am_Inter_Location(&AStack_78);
    }
    Am_Object::~Am_Object(this);
  }
  Am_Object::~Am_Object(this_00);
LAB_001ae7ce:
  Am_Value::~Am_Value(&local_68);
  return;
}

Assistant:

void
Am_Inter_Call_Method(Am_Object &inter_or_cmd, Am_Slot_Key method_slot, int x,
                     int y, Am_Object &ref_obj, Am_Input_Char &ic,
                     Am_Object &object_modified, Am_Inter_Location &points)
{
  //be careful that have object and it has the slot and the slot has a method
  if (inter_or_cmd.Valid()) {
    Am_Value method_value;
    method_value = inter_or_cmd.Peek(method_slot);
    if (method_value.Valid()) {
      Am_Method_Wrapper *wrapper;
      wrapper = method_value;
      Am_INTER_TRACE_PRINT_NOENDL(
          inter_or_cmd, "%%Executing " << Am_Get_Slot_Name(method_slot)
                                       << " of " << inter_or_cmd << "=");
      Am_ID_Tag id = wrapper->ID();
      if (id == Am_Object_Method::Am_Object_Method_ID) {
        Am_Object_Method method;
        method = wrapper;
        Am_INTER_TRACE_PRINT(inter_or_cmd, method);
        if (method.Valid())
          method.Call(inter_or_cmd);
      } else if (id == Am_Mouse_Event_Method::Am_Mouse_Event_Method_ID) {
        Am_Mouse_Event_Method method;
        method = wrapper;
        Am_INTER_TRACE_PRINT(inter_or_cmd, method);
        if (method.Valid())
          method.Call(inter_or_cmd, x, y, ref_obj, ic);
      } else if (id ==
                 Am_Current_Location_Method::Am_Current_Location_Method_ID) {
        if (!points.Valid())
          Am_Error("Method of type Current_Location_Method but no data points",
                   inter_or_cmd, method_slot);
        Am_Current_Location_Method method;
        method = wrapper;
        Am_INTER_TRACE_PRINT(inter_or_cmd, method);
        if (method.Valid())
          method.Call(inter_or_cmd, object_modified, points);
      } else
        Am_Error("Wrong type method: can only accept methods of types "
                 "Am_Object_Method, Am_Mouse_Event_Method, or "
                 "Am_Current_Location_Method.",
                 inter_or_cmd, method_slot);
    }
  }
}